

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMulu<(moira::Core)2,(moira::Instr)82,(moira::Mode)8,2>(Moira *this,u16 opcode)

{
  this->cp = 0;
  execMuluMusashi<(moira::Core)2,(moira::Instr)82,(moira::Mode)8,2>(this,opcode);
  (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 0x1f));
  return;
}

Assistant:

void
Moira::execMulu(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    if constexpr (MOIRA_MIMIC_MUSASHI) {
        execMuluMusashi<C, I, M, S>(opcode);
    } else {
        execMuluMoira<C, I, M, S>(opcode);
    }

    //           00  10  20        00  10  20        00  10  20
    //           .b  .b  .b        .w  .w  .w        .l  .l  .l
    CYCLES_DN   ( 0,  0,  0,       54,  30,  27,      0,  0,  0)
    CYCLES_AI   ( 0,  0,  0,       58,  34,  31,      0,  0,  0)
    CYCLES_PI   ( 0,  0,  0,       58,  34,  31,      0,  0,  0)
    CYCLES_PD   ( 0,  0,  0,       60,  36,  32,      0,  0,  0)
    CYCLES_DI   ( 0,  0,  0,       62,  38,  32,      0,  0,  0)
    CYCLES_IX   ( 0,  0,  0,       64,  40,  34,      0,  0,  0)
    CYCLES_AW   ( 0,  0,  0,       62,  38,  31,      0,  0,  0)
    CYCLES_AL   ( 0,  0,  0,       66,  42,  31,      0,  0,  0)
    CYCLES_DIPC ( 0,  0,  0,       62,  38,  32,      0,  0,  0)
    CYCLES_IXPC ( 0,  0,  0,       64,  40,  34,      0,  0,  0)
    CYCLES_IM   ( 0,  0,  0,       58,  34,  29,      0,  0,  0)

    FINALIZE;
}